

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

char * getSelectionString(Atom selection)

{
  long lVar1;
  unsigned_long uVar2;
  int iVar3;
  Window WVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  Atom AVar8;
  Atom AVar9;
  long lVar10;
  size_t __size;
  bool bVar11;
  char *data;
  uint local_1fc;
  Atom local_1f8;
  int actualFormat;
  Atom local_1e8;
  long local_1e0;
  Atom local_1d8;
  unsigned_long itemCount;
  Atom actualType;
  unsigned_long bytesAfter;
  Atom local_1b8;
  XEvent notification;
  XEvent dummy;
  
  local_1f8 = _glfw.x11.UTF8_STRING;
  local_1b8 = 0x1f;
  bVar11 = _glfw.x11.PRIMARY != selection;
  WVar4 = XGetSelectionOwner(_glfw.x11.display,selection);
  pcVar5 = *(char **)(_glfw.x11.keyName + (ulong)bVar11 * 8 + -0x10);
  if (WVar4 != _glfw.x11.helperWindowHandle) {
    lVar1 = (ulong)bVar11 * 8;
    lVar10 = lVar1 + 0x1ff08;
    free(pcVar5);
    *(undefined8 *)(_glfw.x11.keyName + lVar1 + -0x10) = 0;
    uVar7 = CONCAT71((int7)(WVar4 >> 8),1);
    local_1e8 = local_1b8;
    AVar8 = local_1f8;
    AVar9 = local_1b8;
    local_1e0 = lVar10;
    local_1d8 = selection;
    do {
      while( true ) {
        local_1fc = (uint)uVar7;
        local_1f8 = AVar8;
        XConvertSelection(_glfw.x11.display,selection,AVar8,_glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,0);
        while (iVar3 = XCheckTypedWindowEvent
                                 (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,&notification)
              , iVar3 == 0) {
          waitForEvent((double *)0x0);
        }
        if (notification.xkey.time == 0) break;
        XCheckIfEvent(_glfw.x11.display,&dummy,isSelPropNewValueNotify,&notification);
        XGetWindowProperty(_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                           0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                           &data);
        if (actualType == _glfw.x11.INCR) {
          __size = 1;
          pcVar5 = (char *)0x0;
          while( true ) {
            while (iVar3 = XCheckIfEvent(_glfw.x11.display,&dummy,isSelPropNewValueNotify,
                                         &notification), iVar3 == 0) {
              waitForEvent((double *)0x0);
            }
            XFree(data);
            XGetWindowProperty(_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                               0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,
                               &bytesAfter,&data);
            uVar2 = itemCount;
            if (itemCount == 0) break;
            __size = __size + itemCount;
            pcVar5 = (char *)realloc(pcVar5,__size);
            pcVar5[~uVar2 + __size] = '\0';
            strcat(pcVar5,data);
          }
          if (local_1f8 == 0x1f) {
            pcVar6 = convertLatin1toUTF8(pcVar5);
            lVar10 = local_1e0;
            *(char **)((long)&_glfw.initialized + local_1e0) = pcVar6;
            free(pcVar5);
            AVar9 = local_1e8;
            selection = local_1d8;
          }
          else {
            *(char **)((long)&_glfw.initialized + local_1e0) = pcVar5;
            AVar9 = local_1e8;
            lVar10 = local_1e0;
            selection = local_1d8;
          }
        }
        else if (actualType == local_1f8) {
          if (local_1f8 == 0x1f) {
            pcVar5 = convertLatin1toUTF8(data);
          }
          else {
            pcVar5 = _glfw_strdup(data);
          }
          *(char **)((long)&_glfw.initialized + lVar10) = pcVar5;
        }
        XFree(data);
        pcVar5 = *(char **)((long)&_glfw.initialized + lVar10);
        uVar7 = 0;
        AVar8 = AVar9;
        if (((byte)local_1fc & pcVar5 == (char *)0x0) == 0) goto LAB_00134135;
      }
      uVar7 = 0;
      AVar8 = AVar9;
    } while ((local_1fc & 1) != 0);
    pcVar5 = *(char **)((long)&_glfw.initialized + lVar10);
LAB_00134135:
    if (pcVar5 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
      pcVar5 = *(char **)((long)&_glfw.initialized + lVar10);
    }
  }
  return pcVar5;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    size_t i;
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}